

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralContactClipping.cpp
# Opt level: O3

void cbtPolyhedralContactClipping::clipFaceAgainstHull
               (cbtVector3 *separatingNormal,cbtConvexPolyhedron *hullA,cbtTransform *transA,
               cbtVertexArray *worldVertsB1,cbtVertexArray *worldVertsB2,cbtScalar minDist,
               cbtScalar maxDist,Result *resultOut)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  float fVar5;
  float fVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  cbtScalar cVar10;
  cbtScalar cVar11;
  cbtScalar cVar12;
  float fVar13;
  int iVar14;
  cbtFace *pcVar15;
  int *piVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined8 uVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  int iVar23;
  cbtVector3 *pcVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  cbtScalar *pcVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  cbtVertexArray *pVtxIn;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  float fVar44;
  undefined1 auVar45 [64];
  cbtVector3 point;
  cbtVector3 local_68;
  cbtScalar local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_58 = minDist;
  uStack_54 = in_XMM0_Db;
  uStack_50 = in_XMM0_Dc;
  uStack_4c = in_XMM0_Dd;
  if ((worldVertsB2->m_size < 0) && (worldVertsB2->m_capacity < 0)) {
    if ((worldVertsB2->m_data != (cbtVector3 *)0x0) && (worldVertsB2->m_ownsMemory == true)) {
      cbtAlignedFreeInternal(worldVertsB2->m_data);
    }
    worldVertsB2->m_ownsMemory = true;
    worldVertsB2->m_data = (cbtVector3 *)0x0;
    worldVertsB2->m_capacity = 0;
  }
  worldVertsB2->m_size = 0;
  iVar23 = worldVertsB1->m_size;
  if (worldVertsB2->m_capacity < iVar23) {
    if (iVar23 == 0) {
      pcVar24 = (cbtVector3 *)0x0;
    }
    else {
      pcVar24 = (cbtVector3 *)cbtAlignedAllocInternal((long)iVar23 << 4,0x10);
      iVar14 = worldVertsB2->m_size;
      if (0 < (long)iVar14) {
        lVar27 = 0;
        do {
          puVar1 = (undefined8 *)((long)worldVertsB2->m_data->m_floats + lVar27);
          uVar20 = puVar1[1];
          puVar2 = (undefined8 *)((long)pcVar24->m_floats + lVar27);
          *puVar2 = *puVar1;
          puVar2[1] = uVar20;
          lVar27 = lVar27 + 0x10;
        } while ((long)iVar14 * 0x10 != lVar27);
      }
    }
    if ((worldVertsB2->m_data != (cbtVector3 *)0x0) && (worldVertsB2->m_ownsMemory == true)) {
      cbtAlignedFreeInternal(worldVertsB2->m_data);
    }
    worldVertsB2->m_ownsMemory = true;
    worldVertsB2->m_data = pcVar24;
    worldVertsB2->m_capacity = iVar23;
  }
  uVar25 = (ulong)(hullA->m_faces).m_size;
  if (0 < (long)uVar25) {
    auVar45 = ZEXT464(0x7f7fffff);
    uVar29 = 0xffffffff;
    uVar30 = 0;
    pcVar28 = ((hullA->m_faces).m_data)->m_plane + 2;
    do {
      fVar44 = pcVar28[-1];
      cVar3 = pcVar28[-2];
      cVar4 = *pcVar28;
      auVar32 = vmulss_avx512f(ZEXT416((uint)fVar44),
                               ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[1]));
      auVar33 = vmulss_avx512f(ZEXT416((uint)fVar44),
                               ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[1]));
      auVar34 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[0]),
                                    ZEXT416((uint)cVar3));
      auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[0]),
                                    ZEXT416((uint)cVar3));
      auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * (transA->m_basis).m_el[2].m_floats[1])),
                                ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[0]),
                                ZEXT416((uint)cVar3));
      auVar34 = vfmadd231ss_avx512f(auVar34,ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[2]),
                                    ZEXT416((uint)cVar4));
      auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[2]),
                                    ZEXT416((uint)cVar4));
      auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[2]),
                                ZEXT416((uint)cVar4));
      auVar34 = vmulss_avx512f(auVar34,ZEXT416((uint)separatingNormal->m_floats[1]));
      auVar33 = vfmadd231ss_avx512f(auVar34,ZEXT416((uint)separatingNormal->m_floats[0]),auVar33);
      auVar33 = vfmadd213ss_avx512f(auVar32,ZEXT416((uint)separatingNormal->m_floats[2]),auVar33);
      fVar44 = auVar45._0_4_;
      auVar32 = vminss_avx(auVar33,auVar45._0_16_);
      auVar45 = ZEXT1664(auVar32);
      if (auVar33._0_4_ < fVar44) {
        uVar29 = uVar30 & 0xffffffff;
      }
      uVar30 = uVar30 + 1;
      pcVar28 = pcVar28 + 0xc;
    } while (uVar25 != uVar30);
    if (-1 < (int)uVar29) {
      pcVar15 = (hullA->m_faces).m_data;
      uVar25 = (ulong)pcVar15[uVar29].m_indices.m_size;
      if (0 < (long)uVar25) {
        uVar30 = 0;
        pVtxIn = worldVertsB1;
        do {
          worldVertsB1 = worldVertsB2;
          piVar16 = pcVar15[uVar29].m_indices.m_data;
          pcVar24 = (hullA->m_vertices).m_data;
          fVar44 = (transA->m_basis).m_el[0].m_floats[1];
          fVar5 = (transA->m_basis).m_el[1].m_floats[1];
          fVar6 = (transA->m_basis).m_el[2].m_floats[1];
          cVar3 = (transA->m_basis).m_el[0].m_floats[0];
          cVar4 = (transA->m_basis).m_el[1].m_floats[0];
          cVar7 = (transA->m_basis).m_el[2].m_floats[0];
          cVar8 = (transA->m_basis).m_el[0].m_floats[2];
          cVar9 = (transA->m_basis).m_el[1].m_floats[2];
          cVar10 = (transA->m_basis).m_el[2].m_floats[2];
          cVar11 = pcVar15[uVar29].m_plane[1];
          cVar12 = pcVar15[uVar29].m_plane[2];
          iVar23 = piVar16[uVar30];
          uVar30 = uVar30 + 1;
          auVar32 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)cVar11));
          auVar33 = vmulss_avx512f(ZEXT416((uint)fVar44),ZEXT416((uint)cVar11));
          auVar34 = vmulss_avx512f(ZEXT416((uint)fVar6),ZEXT416((uint)cVar11));
          uVar31 = 0;
          if (uVar30 != uVar25) {
            uVar31 = uVar30 & 0xffffffff;
          }
          fVar13 = pcVar24[iVar23].m_floats[1];
          iVar14 = piVar16[uVar31];
          fVar17 = fVar13 - pcVar24[iVar14].m_floats[1];
          fVar18 = pcVar24[iVar23].m_floats[0] - pcVar24[iVar14].m_floats[0];
          fVar19 = pcVar24[iVar23].m_floats[2] - pcVar24[iVar14].m_floats[2];
          auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar44)),ZEXT416((uint)cVar3),
                                    ZEXT416((uint)fVar18));
          auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar17)),ZEXT416((uint)cVar4),
                                    ZEXT416((uint)fVar18));
          auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar17)),ZEXT416((uint)cVar7),
                                    ZEXT416((uint)fVar18));
          auVar38 = ZEXT416((uint)pcVar24[iVar23].m_floats[0]);
          auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * fVar44)),auVar38,ZEXT416((uint)cVar3));
          auVar41 = vfmadd231ss_fma(auVar41,ZEXT416((uint)cVar8),ZEXT416((uint)fVar19));
          auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)cVar9),ZEXT416((uint)fVar19));
          auVar35 = vfmadd231ss_avx512f(auVar22,ZEXT416((uint)cVar10),ZEXT416((uint)fVar19));
          cVar11 = pcVar15[uVar29].m_plane[0];
          auVar39 = ZEXT416((uint)pcVar24[iVar23].m_floats[2]);
          auVar22 = vfmadd231ss_fma(auVar36,auVar39,ZEXT416((uint)cVar8));
          auVar36 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)cVar4),ZEXT416((uint)cVar11));
          auVar37 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)cVar3),ZEXT416((uint)cVar11));
          auVar34 = vfmadd231ss_avx512f(auVar34,ZEXT416((uint)cVar7),ZEXT416((uint)cVar11));
          auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar13)),auVar38,ZEXT416((uint)cVar4));
          auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar13)),auVar38,ZEXT416((uint)cVar7));
          auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)cVar9),ZEXT416((uint)cVar12));
          auVar34 = vfmadd231ss_avx512f(auVar34,ZEXT416((uint)cVar10),ZEXT416((uint)cVar12));
          auVar37 = vfmadd231ss_avx512f(auVar37,ZEXT416((uint)cVar8),ZEXT416((uint)cVar12));
          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar33 = vfmadd231ss_avx512f(auVar33,auVar39,ZEXT416((uint)cVar10));
          auVar32 = vfmadd231ss_fma(auVar32,auVar39,ZEXT416((uint)cVar9));
          auVar39 = vmulss_avx512f(auVar36,auVar35);
          auVar39 = vfmsub231ss_avx512f(auVar39,auVar40,auVar34);
          auVar34 = vmulss_avx512f(auVar34,auVar41);
          auVar34 = vfmsub231ss_avx512f(auVar34,auVar37,auVar35);
          auVar40 = vmulss_avx512f(auVar37,auVar40);
          auVar41 = vfmsub231ss_avx512f(auVar40,auVar41,auVar36);
          auVar40 = vmulss_avx512f(ZEXT416((uint)(auVar32._0_4_ + (transA->m_origin).m_floats[1])),
                                   auVar34);
          auVar32 = vinsertps_avx512f(auVar39,auVar34,0x1c);
          auVar34 = vxorps_avx512vl(auVar32,auVar38);
          auVar32 = vfnmsub231ss_fma(auVar40,auVar39,
                                     ZEXT416((uint)(auVar22._0_4_ + (transA->m_origin).m_floats[0]))
                                    );
          auVar40 = vxorps_avx512vl(auVar41,auVar38);
          local_68.m_floats = (cbtScalar  [4])vinsertps_avx(auVar34,auVar40,0x28);
          auVar32 = vfnmadd231ss_fma(auVar32,auVar41,
                                     ZEXT416((uint)(auVar33._0_4_ + (transA->m_origin).m_floats[2]))
                                    );
          auVar32 = vxorps_avx512vl(auVar32,auVar38);
          clipFace(pVtxIn,worldVertsB1,&local_68,auVar32._0_4_);
          lVar27 = (long)pVtxIn->m_size;
          if (lVar27 < 0) {
            if (pVtxIn->m_capacity < 0) {
              if ((pVtxIn->m_data != (cbtVector3 *)0x0) && (pVtxIn->m_ownsMemory == true)) {
                cbtAlignedFreeInternal(pVtxIn->m_data);
              }
              pVtxIn->m_ownsMemory = true;
              pVtxIn->m_data = (cbtVector3 *)0x0;
              pVtxIn->m_capacity = 0;
            }
            lVar26 = lVar27 << 4;
            do {
              puVar1 = (undefined8 *)((long)pVtxIn->m_data->m_floats + lVar26);
              *puVar1 = local_40;
              puVar1[1] = uStack_38;
              lVar26 = lVar26 + 0x10;
              lVar27 = lVar27 + 1;
            } while (lVar27 != 0);
          }
          pVtxIn->m_size = 0;
          worldVertsB2 = pVtxIn;
          pVtxIn = worldVertsB1;
        } while (uVar30 != uVar25);
      }
      iVar23 = worldVertsB1->m_size;
      if (0 < iVar23) {
        fVar44 = pcVar15[uVar29].m_plane[1];
        cVar3 = pcVar15[uVar29].m_plane[0];
        cVar4 = pcVar15[uVar29].m_plane[2];
        fVar5 = pcVar15[uVar29].m_plane[3];
        lVar27 = 0;
        auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * (transA->m_basis).m_el[1].m_floats[1])),
                                  ZEXT416((uint)cVar3),
                                  ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[0]));
        auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * (transA->m_basis).m_el[0].m_floats[1])),
                                  ZEXT416((uint)cVar3),
                                  ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[0]));
        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * (transA->m_basis).m_el[2].m_floats[1])),
                                  ZEXT416((uint)cVar3),
                                  ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[0]));
        auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)cVar4),
                                  ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[2]));
        auVar42 = ZEXT1664(auVar32);
        auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)cVar4),
                                  ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[2]));
        auVar45 = ZEXT1664(auVar33);
        auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)cVar4),
                                  ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[2]));
        auVar43 = ZEXT1664(auVar34);
        auVar41 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ * (transA->m_origin).m_floats[1])),
                                  auVar33,ZEXT416((uint)(transA->m_origin).m_floats[0]));
        auVar41 = vfmadd231ss_fma(auVar41,auVar34,ZEXT416((uint)(transA->m_origin).m_floats[2]));
        lVar26 = 0;
        do {
          pcVar24 = worldVertsB1->m_data;
          auVar22._4_4_ = uStack_54;
          auVar22._0_4_ = local_58;
          auVar22._8_4_ = uStack_50;
          auVar22._12_4_ = uStack_4c;
          auVar40 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ *
                                                  *(float *)((long)pcVar24->m_floats + lVar27 + 4)))
                                    ,auVar45._0_16_,
                                    ZEXT416(*(uint *)((long)pcVar24->m_floats + lVar27)));
          auVar40 = vfmadd231ss_fma(auVar40,auVar43._0_16_,
                                    ZEXT416(*(uint *)((long)pcVar24->m_floats + lVar27 + 8)));
          fVar44 = (fVar5 - auVar41._0_4_) + auVar40._0_4_;
          uVar20 = vcmpss_avx512f(ZEXT416((uint)fVar44),auVar22,2);
          bVar21 = (bool)((byte)uVar20 & 1);
          if ((float)((uint)bVar21 * (int)local_58 + (uint)!bVar21 * (int)fVar44) <= maxDist) {
            local_68.m_floats = *(cbtScalar (*) [4])((long)pcVar24->m_floats + lVar27);
            (*resultOut->_vptr_Result[4])(resultOut,separatingNormal,&local_68);
            auVar43 = ZEXT464(auVar34._0_4_);
            auVar42 = ZEXT464((uint)auVar32._0_4_);
            auVar45 = ZEXT464(auVar33._0_4_);
            iVar23 = worldVertsB1->m_size;
          }
          lVar26 = lVar26 + 1;
          lVar27 = lVar27 + 0x10;
        } while (lVar26 < iVar23);
      }
    }
  }
  return;
}

Assistant:

void cbtPolyhedralContactClipping::clipFaceAgainstHull(const cbtVector3& separatingNormal, const cbtConvexPolyhedron& hullA, const cbtTransform& transA, cbtVertexArray& worldVertsB1, cbtVertexArray& worldVertsB2, const cbtScalar minDist, cbtScalar maxDist, cbtDiscreteCollisionDetectorInterface::Result& resultOut)
{
	worldVertsB2.resize(0);
	cbtVertexArray* pVtxIn = &worldVertsB1;
	cbtVertexArray* pVtxOut = &worldVertsB2;
	pVtxOut->reserve(pVtxIn->size());

	int closestFaceA = -1;
	{
		cbtScalar dmin = FLT_MAX;
		for (int face = 0; face < hullA.m_faces.size(); face++)
		{
			const cbtVector3 Normal(hullA.m_faces[face].m_plane[0], hullA.m_faces[face].m_plane[1], hullA.m_faces[face].m_plane[2]);
			const cbtVector3 faceANormalWS = transA.getBasis() * Normal;

			cbtScalar d = faceANormalWS.dot(separatingNormal);
			if (d < dmin)
			{
				dmin = d;
				closestFaceA = face;
			}
		}
	}
	if (closestFaceA < 0)
		return;

	const cbtFace& polyA = hullA.m_faces[closestFaceA];

	// clip polygon to back of planes of all faces of hull A that are adjacent to witness face
	int numVerticesA = polyA.m_indices.size();
	for (int e0 = 0; e0 < numVerticesA; e0++)
	{
		const cbtVector3& a = hullA.m_vertices[polyA.m_indices[e0]];
		const cbtVector3& b = hullA.m_vertices[polyA.m_indices[(e0 + 1) % numVerticesA]];
		const cbtVector3 edge0 = a - b;
		const cbtVector3 WorldEdge0 = transA.getBasis() * edge0;
		cbtVector3 worldPlaneAnormal1 = transA.getBasis() * cbtVector3(polyA.m_plane[0], polyA.m_plane[1], polyA.m_plane[2]);

		cbtVector3 planeNormalWS1 = -WorldEdge0.cross(worldPlaneAnormal1);  //.cross(WorldEdge0);
		cbtVector3 worldA1 = transA * a;
		cbtScalar planeEqWS1 = -worldA1.dot(planeNormalWS1);

//int otherFace=0;
#ifdef BLA1
		int otherFace = polyA.m_connectedFaces[e0];
		cbtVector3 localPlaneNormal(hullA.m_faces[otherFace].m_plane[0], hullA.m_faces[otherFace].m_plane[1], hullA.m_faces[otherFace].m_plane[2]);
		cbtScalar localPlaneEq = hullA.m_faces[otherFace].m_plane[3];

		cbtVector3 planeNormalWS = transA.getBasis() * localPlaneNormal;
		cbtScalar planeEqWS = localPlaneEq - planeNormalWS.dot(transA.getOrigin());
#else
		cbtVector3 planeNormalWS = planeNormalWS1;
		cbtScalar planeEqWS = planeEqWS1;

#endif
		//clip face

		clipFace(*pVtxIn, *pVtxOut, planeNormalWS, planeEqWS);
		cbtSwap(pVtxIn, pVtxOut);
		pVtxOut->resize(0);
	}

	//#define ONLY_REPORT_DEEPEST_POINT

	cbtVector3 point;

	// only keep points that are behind the witness face
	{
		cbtVector3 localPlaneNormal(polyA.m_plane[0], polyA.m_plane[1], polyA.m_plane[2]);
		cbtScalar localPlaneEq = polyA.m_plane[3];
		cbtVector3 planeNormalWS = transA.getBasis() * localPlaneNormal;
		cbtScalar planeEqWS = localPlaneEq - planeNormalWS.dot(transA.getOrigin());
		for (int i = 0; i < pVtxIn->size(); i++)
		{
			cbtVector3 vtx = pVtxIn->at(i);
			cbtScalar depth = planeNormalWS.dot(vtx) + planeEqWS;
			if (depth <= minDist)
			{
				//				printf("clamped: depth=%f to minDist=%f\n",depth,minDist);
				depth = minDist;
			}

			if (depth <= maxDist)
			{
				cbtVector3 point = pVtxIn->at(i);
#ifdef ONLY_REPORT_DEEPEST_POINT
				curMaxDist = depth;
#else
#if 0
				if (depth<-3)
				{
					printf("error in cbtPolyhedralContactClipping depth = %f\n", depth);
					printf("likely wrong separatingNormal passed in\n");
				}
#endif
				resultOut.addContactPoint(separatingNormal, point, depth);
#endif
			}
		}
	}
#ifdef ONLY_REPORT_DEEPEST_POINT
	if (curMaxDist < maxDist)
	{
		resultOut.addContactPoint(separatingNormal, point, curMaxDist);
	}
#endif  //ONLY_REPORT_DEEPEST_POINT
}